

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QLocale::dateFormat(QString *__return_storage_ptr__,QLocale *this,FormatType format)

{
  QLocaleData *pQVar1;
  bool bVar2;
  QSystemLocale *pQVar3;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    local_68._16_8_ = 0;
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = 0;
    local_50 = 2;
    (*pQVar3->_vptr_QSystemLocale[2])(&local_48,pQVar3,(ulong)(8 - (format == LongFormat)));
    ::QVariant::~QVariant((QVariant *)&local_68);
    bVar2 = ::QVariant::isNull((QVariant *)&local_48);
    if (!bVar2) {
      ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_48);
      ::QVariant::~QVariant((QVariant *)&local_48);
      goto LAB_002db066;
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  pQVar1 = ((this->d).d.ptr)->m_data;
  local_48.shared =
       (PrivateShared *)
       ((ulong)(byte)pQVar1->m_currency_iso_code[((ulong)(format == LongFormat) ^ 0x61) - 0x75] <<
        0x20 | (ulong)*(ushort *)
                       (pQVar1->m_currency_iso_code + (ulong)(format != LongFormat) * 2 + -0x4f));
  QLocaleData::DataRange::getData
            (__return_storage_ptr__,(DataRange *)&local_48.shared,
             L"dddd, d MMMM yyyyd MMM yyyydddd, d MMMM yyyy \'ш\'.dd.MM.yyyydddd, MMMM dd, yyyydd/MM/yydddd dd MMMM yyyyyyyy-MM-dddddd d MMMM yyyyd/M/yyyyddd, MMMM d, yyyyM/d/yyyyyy MMMM d, ddddd.M.yydd/MM/yyyydddd، d MMMM yyyyd\x200f/M\x200f/yyyydddd, d MMMM \'de\' yyyyyyyy թ. MMMM d, dddddddd, d MMMM, yyyyd-M-yyyydddd, yyyy MMMM ddyy/MM/ddd MMMM yyyy, ddddyyyy(\'e\')\'ko\' MMMM\'ren\' d(\'a\'), ddddyy/M/ddddd, d MMMM yyyy\x202f\'г\'.dddd፡ dd MMMM ግርጋ yyyydd-MM-yyyydddd, d. MMMM yyyy.d. M. yyyy.dddd, dd. MMMM yyyy.d.M.yy.d.MM.yy\x202f\'г\'.yyyy MMMM d ddddyyyy年M月d日 ddddyyyy/M/dyyyy年M月d日dddddddd, d MMMM \'del\' yyyydddd, MMMM d, yyyydddd, d MMMM \'л\'. yyyy.yyyy.MM.dddddd, d MMMM yyyy\x202f\'ҫ\'.dddd, \'dä\' d. MMMM yyyydddd d MMMM \'di\' \'u\' yyyydd. MM. yyyy.d. M. yy.dddd d. MMMM yyyydddd \'den\' d. MMMM yyyydddd, d, MMMM yyyydddd, སྤྱི་ལོ་yyyy MMMM ཚེས་dddddd, dd MMMM yyyyyyyy/MM/dddddd, \'la\' d-\'a\' \'de\' MMMM yyyydddd, MMMM d \'lia\' yyyyd.M.yyyydddd d \'di\' MMMM \'dal\' yyyydddd d MMMM⹁ yyyydddd, d\'mh\' MMMM yyyydddd, d \'de\' MMMM \'de\' yyyydddd፥ dd MMMM መዓልት yyyydddd, dd MMMM, yyyydddd d MMMM, yyyydddd, d בMMMM yyyyyyyy. MMMM d., ddddyyyy. MM. dd.dddd, MMMM d. yyyydddd \'le\' d \'de\' MMMM yyyyMM/dd/yyyydddd, d \'di\' MMMM \'di\' yyyydd/MM yyyyyyyy\x202f\'ж\'. d MMMM, ddddyyyy d-MMMM، ddddyyyy년 MMMM d일 ddddyy. M. d.dddd, d\'ê\' MMMM\'a\' yyyy\'an\'yyyy-\'ж\'., d-MMMM, dddddddd, \'die\' d MMMM yyyyd M yyyydddd, yyyy. \'gada\' d. MMMMyyyy \'m\'. MMMM d \'d\'., dddddddd, \'de\' d. MMMM yyyyyyyy, MMMM d, dddddddd, d \'ta\'’ MMMM yyyyMMMM d, yyyy, ddddyyyy\x202f\'оны\' MMMM\'ын\' d, dddd \'гараг\'yyyy ᠣᠨ \x180e\x180e\x180eᠤ MMMM\x180e\x180eᠢᠢᠨd. dddd \x180bᠭᠠᠷᠠᠭdddd , \'lyɛ\'̌ʼ d \'na\' MMMM, yyyydddd d MMMM \'de\' yyyydddd, d MMMM, yyyy\x202f\'аз\'dddd د yyyy د MMMM ddddd, yyyy \'mettas\' d. MMMMdddd, \'ils\' d MMMM yyyyyyyy\x202f\'сыл\' MMMM d \'күнэ\', dddddddd d \'de\' MMMM \'de\' \'su\' yyyydddd dd \'de\' MMMM \'de\' yyyydddd، d ܒMMMM yyyyd MMMM, yyyy\x202f\'ел\', ddddd, MMMM yyyy, ddddddddที่ d MMMM yyyyyyyy MMMMའི་ཚེས་d, dddddddd፡ dd MMMM ዮም yyyydddd፣ d MMMM yyyyd MMMM yyyy dddddddd, d MMMM yyyy\x202f\'р\'.dddd، d MMMM، yyyydddd, d-MMMM, yyyyyyyy نچی ییل d نچی MMMM dddd کونیyyyy MMMM\'a\' \'d\'. d\'id\'dddd፥ dd ..." /* TRUNCATED STRING LITERAL */
            );
LAB_002db066:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::dateFormat(FormatType format) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::DateFormatLong
                                             : QSystemLocale::DateFormatShort,
                                             QVariant());
        if (!res.isNull())
            return res.toString();
    }
#endif

    return (format == LongFormat
            ? d->m_data->longDateFormat()
            : d->m_data->shortDateFormat()
           ).getData(date_format_data);
}